

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_dex_clears_z_flag_Test::~CpuTest_dex_clears_z_flag_Test
          (CpuTest_dex_clears_z_flag_Test *this)

{
  CpuTest_dex_clears_z_flag_Test *this_local;
  
  ~CpuTest_dex_clears_z_flag_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, dex_clears_z_flag) {
    stage_instruction(DEX);
    registers.x = 0;
    registers.p |= Z_FLAG;
    expected.x = 255;
    expected.p |= N_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}